

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O2

void __thiscall
solitaire::piles::FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test::
TestBody(FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test *this)

{
  element_type *peVar1;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  char *pcVar2;
  AssertHelper local_80;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_50;
  Card cardWithDifferentSuitThanOnTopOfPile;
  optional<solitaire::cards::Card> cardToAdd;
  
  solitaire::cards::Card::Card(&cardWithDifferentSuitThanOnTopOfPile,Two,Spade);
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload._M_value =
       cardWithDifferentSuitThanOnTopOfPile;
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_engaged = true;
  peVar1 = (this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.pile.
           super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_FoundationPile).super_Archiver._vptr_Archiver[4])(peVar1,&cardToAdd);
  testing::internal::CmpHelperEQ<std::optional<solitaire::cards::Card>,solitaire::cards::Card>
            ((internal *)&gtest_ar,"cardToAdd","cardWithDifferentSuitThanOnTopOfPile",&cardToAdd,
             &cardWithDifferentSuitThanOnTopOfPile);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
              *)&local_50,(testing *)&(this->super_FoundationPileWithAceTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
              *)&gtest_ar,(internal *)&local_50,matcher);
  (*(((this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&gtest_ar_1,&gtest_ar.success_,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            ((_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &gtest_ar);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_50);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST_F(FoundationPileWithAceTest,
       tryAddCardWithDifferentSuitThanOnTopOfPile)
{
    const Card cardWithDifferentSuitThanOnTopOfPile {Value::Two, Suit::Spade};
    std::optional<Card> cardToAdd = cardWithDifferentSuitThanOnTopOfPile;

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, cardWithDifferentSuitThanOnTopOfPile);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}